

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

bool __thiscall units::precise_unit::operator==(precise_unit *this,unit *other)

{
  bool bVar1;
  unit *in_RSI;
  unit_data *in_RDI;
  double dVar2;
  unit_data *in_stack_ffffffffffffffd8;
  double dVar3;
  float val1;
  undefined1 local_1;
  unit_data *puVar4;
  
  puVar4 = in_RDI;
  bVar1 = units::detail::unit_data::operator!=(in_RDI,in_stack_ffffffffffffffd8);
  val1 = SUB84(puVar4,0);
  if (bVar1) {
    local_1 = false;
  }
  else {
    dVar3 = *(double *)in_RDI;
    dVar2 = unit::multiplier(in_RSI);
    if ((dVar3 != dVar2) || (NAN(dVar3) || NAN(dVar2))) {
      local_1 = units::detail::compare_round_equals(val1,(float)((ulong)in_RSI >> 0x20));
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool operator==(const unit& other) const
    {
        if (base_units_ != other.base_units_) {
            return false;
        }
        if (multiplier_ == other.multiplier()) {
            return true;
        }
        return detail::compare_round_equals(
            static_cast<float>(multiplier_), other.multiplier_);
    }